

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_Raise(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  AActor *thing;
  bool bVar2;
  TActorIterator<AActor> local_20;
  
  if (arg0 == 0) {
    bVar2 = P_Thing_Raise(it,(AActor *)0x0);
  }
  else {
    local_20.super_FActorIterator.base = (AActor *)0x0;
    bVar2 = false;
    local_20.super_FActorIterator.id = arg0;
    while( true ) {
      thing = TActorIterator<AActor>::Next(&local_20);
      if (thing == (AActor *)0x0) break;
      bVar1 = P_Thing_Raise(thing,(AActor *)0x0);
      bVar2 = (bool)(bVar2 | bVar1);
    }
  }
  return (uint)bVar2;
}

Assistant:

FUNC(LS_Thing_Raise)
// Thing_Raise(tid)
{
	AActor * target;
	bool ok = false;

	if (arg0==0)
	{
		ok = P_Thing_Raise (it,NULL);
	}
	else
	{
		TActorIterator<AActor> iterator (arg0);

		while ( (target = iterator.Next ()) )
		{
			ok |= P_Thing_Raise(target,NULL);
		}
	}
	return ok;
}